

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

int64_t __thiscall leveldb::VersionSet::NumLevelBytes(VersionSet *this,int level)

{
  pointer ppFVar1;
  int64_t iVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  
  if (level < 0) {
    __assert_fail("level >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/version_set.cc"
                  ,0x485,"int64_t leveldb::VersionSet::NumLevelBytes(int) const");
  }
  if (6 < (uint)level) {
    __assert_fail("level < config::kNumLevels",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/version_set.cc"
                  ,0x486,"int64_t leveldb::VersionSet::NumLevelBytes(int) const");
  }
  ppFVar1 = this->current_->files_[(uint)level].
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)this->current_->files_[(uint)level].
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1;
  if (lVar3 == 0) {
    iVar2 = 0;
  }
  else {
    lVar3 = lVar3 >> 3;
    lVar4 = 0;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + ppFVar1[lVar4]->file_size;
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

int64_t VersionSet::NumLevelBytes(int level) const {
  assert(level >= 0);
  assert(level < config::kNumLevels);
  return TotalFileSize(current_->files_[level]);
}